

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O1

int Fra_FraigCecPartitioned
              (Aig_Man_t *pMan1,Aig_Man_t *pMan2,int nConfLimit,int nPartSize,int fSmart,
              int fVerbose)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Vec_Ptr_t *__ptr;
  long lVar6;
  ulong uVar7;
  Aig_Man_t *pAVar8;
  ulong uVar9;
  Aig_Man_t *local_40;
  int local_38;
  uint local_34;
  
  local_38 = nConfLimit;
  __ptr = Aig_ManMiterPartitioned(pMan1,pMan2,nPartSize,fSmart);
  uVar9 = (ulong)(uint)__ptr->nSize;
  if (__ptr->nSize < 1) {
    uVar7 = 0xffffffff;
  }
  else {
    uVar3 = 0;
    do {
      uVar7 = uVar3;
      pAVar8 = (Aig_Man_t *)__ptr->pArray[uVar7];
      local_40 = pAVar8;
      if (fVerbose != 0) {
        uVar1 = pAVar8->nObjs[2];
        local_34 = pAVar8->nObjs[3];
        iVar5 = pAVar8->nObjs[6];
        iVar2 = pAVar8->nObjs[5];
        iVar4 = Aig_ManLevelNum(pAVar8);
        printf("Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
               (ulong)((int)uVar7 + 1),uVar9 & 0xffffffff,(ulong)uVar1,(ulong)local_34,
               (ulong)(uint)(iVar5 + iVar2),iVar4);
        fflush(_stdout);
      }
      iVar5 = Fra_FraigMiterStatus(pAVar8);
      if (iVar5 != 1) {
        if (iVar5 == 0) goto LAB_00688366;
        iVar5 = Fra_FraigCec(&local_40,local_38,0);
        if ((long)__ptr->nSize <= (long)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __ptr->pArray[uVar7] = local_40;
        if (iVar5 != 1) goto LAB_00688366;
      }
      uVar9 = (ulong)__ptr->nSize;
      uVar3 = uVar7 + 1;
    } while ((long)(uVar7 + 1) < (long)uVar9);
  }
  iVar5 = 1;
LAB_00688366:
  if (fVerbose != 0) {
    printf(
          "                                                                                          \r"
          );
    fflush(_stdout);
  }
  if (iVar5 == -1) {
    printf("Timed out after verifying %d partitions (out of %d).\n",uVar7 & 0xffffffff,
           (ulong)(uint)__ptr->nSize);
    fflush(_stdout);
  }
  pAVar8 = local_40;
  if (0 < __ptr->nSize) {
    lVar6 = 0;
    do {
      pAVar8 = (Aig_Man_t *)__ptr->pArray[lVar6];
      Aig_ManStop(pAVar8);
      lVar6 = lVar6 + 1;
    } while (lVar6 < __ptr->nSize);
  }
  local_40 = pAVar8;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  return iVar5;
}

Assistant:

int Fra_FraigCecPartitioned( Aig_Man_t * pMan1, Aig_Man_t * pMan2, int nConfLimit, int nPartSize, int fSmart, int fVerbose )
{
    Aig_Man_t * pAig;
    Vec_Ptr_t * vParts;
    int i, RetValue = 1, nOutputs;
    // create partitions
    vParts = Aig_ManMiterPartitioned( pMan1, pMan2, nPartSize, fSmart );
    // solve the partitions
    nOutputs = -1;
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pAig, i )
    {
        nOutputs++;
        if ( fVerbose )
        {
            printf( "Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
                i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAig), Aig_ManCoNum(pAig), 
                Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
            fflush( stdout );
        }
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue == 1 )
            continue;
        if ( RetValue == 0 )
            break;
        RetValue = Fra_FraigCec( &pAig, nConfLimit, 0 );
        Vec_PtrWriteEntry( vParts, i, pAig );
        if ( RetValue == 1 )
            continue;
        if ( RetValue == 0 )
            break;
        break;
    }
    // clear the result
    if ( fVerbose )
    {
        printf( "                                                                                          \r" );
        fflush( stdout );
    }
    // report the timeout
    if ( RetValue == -1 )
    {
        printf( "Timed out after verifying %d partitions (out of %d).\n", nOutputs, Vec_PtrSize(vParts) );
        fflush( stdout );
    }
    // free intermediate results
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pAig, i )
        Aig_ManStop( pAig );
    Vec_PtrFree( vParts );
    return RetValue;
}